

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O1

PSocketAddress * p_socket_address_new(pchar *address,puint16 port)

{
  sockaddr *native;
  int iVar1;
  char *pcVar2;
  PSocketAddress *pPVar3;
  addrinfo *res;
  addrinfo local_58;
  
  if (address != (pchar *)0x0) {
    pcVar2 = strchr(address,0x3a);
    if (pcVar2 != (char *)0x0) {
      local_58.ai_canonname = (char *)0x0;
      local_58.ai_next = (addrinfo *)0x0;
      local_58.ai_addrlen = 0;
      local_58._20_4_ = 0;
      local_58.ai_addr = (sockaddr *)0x0;
      local_58.ai_socktype = 1;
      local_58.ai_protocol = 0;
      local_58.ai_flags = 4;
      local_58.ai_family = 0;
      iVar1 = getaddrinfo(address,(char *)0x0,&local_58,(addrinfo **)&res);
      if (iVar1 != 0) {
        return (PSocketAddress *)0x0;
      }
      if ((res->ai_family == 10) && (res->ai_addrlen == 0x1c)) {
        native = res->ai_addr;
        *(puint16 *)native->sa_data = port << 8 | port >> 8;
        pPVar3 = p_socket_address_new_from_native(native,0x1c);
      }
      else {
        pPVar3 = (PSocketAddress *)0x0;
      }
      freeaddrinfo((addrinfo *)res);
      return pPVar3;
    }
    pPVar3 = (PSocketAddress *)p_malloc0(0x20);
    if (pPVar3 == (PSocketAddress *)0x0) {
      printf("** Error: %s **\n","PSocketAddress::p_socket_address_new: failed to allocate memory");
      return (PSocketAddress *)0x0;
    }
    pPVar3->port = port;
    iVar1 = inet_pton(2,address,&pPVar3->addr);
    if (0 < iVar1) {
      pPVar3->family = P_SOCKET_FAMILY_INET;
      return pPVar3;
    }
    iVar1 = inet_pton(10,address,&pPVar3->addr);
    if (0 < iVar1) {
      pPVar3->family = P_SOCKET_FAMILY_INET6;
      return pPVar3;
    }
    p_free(pPVar3);
  }
  return (PSocketAddress *)0x0;
}

Assistant:

P_LIB_API PSocketAddress *
p_socket_address_new (const pchar	*address,
		      puint16		port)
{
	PSocketAddress		*ret;
#if defined (P_OS_WIN) || defined (PLIBSYS_HAS_GETADDRINFO)
	struct addrinfo		hints;
	struct addrinfo		*res;
#endif

#ifdef P_OS_WIN
	struct sockaddr_storage	sa;
	struct sockaddr_in 	*sin = (struct sockaddr_in *) &sa;
#  ifdef AF_INET6
	struct sockaddr_in6 	*sin6 = (struct sockaddr_in6 *) &sa;
#  endif /* AF_INET6 */
	pint 			len;
#endif /* P_OS_WIN */

	if (P_UNLIKELY (address == NULL))
		return NULL;

#if (defined (P_OS_WIN) || defined (PLIBSYS_HAS_GETADDRINFO)) && defined (AF_INET6)
	if (strchr (address, ':') != NULL) {
		memset (&hints, 0, sizeof (hints));

		hints.ai_family   = AF_UNSPEC;
		hints.ai_socktype = SOCK_STREAM;
		hints.ai_protocol = 0;
#  ifndef P_OS_UNIXWARE
		hints.ai_flags    = AI_NUMERICHOST;
#  endif

		if (P_UNLIKELY (getaddrinfo (address, NULL, &hints, &res) != 0))
			return NULL;

		if (P_LIKELY (res->ai_family  == AF_INET6 &&
			      res->ai_addrlen == sizeof (struct sockaddr_in6))) {
			((struct sockaddr_in6 *) res->ai_addr)->sin6_port = p_htons (port);
			ret = p_socket_address_new_from_native (res->ai_addr, res->ai_addrlen);
		} else
			ret = NULL;

		freeaddrinfo (res);

		return ret;
	}
#endif

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSocketAddress))) == NULL)) {
		P_ERROR ("PSocketAddress::p_socket_address_new: failed to allocate memory");
		return NULL;
	}

	ret->port = port;

#ifdef P_OS_WIN
	memset (&sa, 0, sizeof (sa));
	len = sizeof (sa);
	sin->sin_family = AF_INET;

	if (WSAStringToAddressA ((LPSTR) address, AF_INET, NULL, (LPSOCKADDR) &sa, &len) == 0) {
		memcpy (&ret->addr.sin_addr, &sin->sin_addr, sizeof (struct in_addr));
		ret->family = P_SOCKET_FAMILY_INET;
		return ret;
	}
#  ifdef AF_INET6
	else {
		sin6->sin6_family = AF_INET6;

		if (WSAStringToAddressA ((LPSTR) address, AF_INET6, NULL, (LPSOCKADDR) &sa, &len) == 0) {
			memcpy (&ret->addr.sin6_addr, &sin6->sin6_addr, sizeof (struct in6_addr));
			ret->family = P_SOCKET_FAMILY_INET6;
			return ret;
		}
	}
#  endif /* AF_INET6 */
#else /* P_OS_WIN */
	if (inet_pton (AF_INET, address, &ret->addr.sin_addr) > 0) {
		ret->family = P_SOCKET_FAMILY_INET;
		return ret;
	}
#  ifdef AF_INET6
	else if (inet_pton (AF_INET6, address, &ret->addr.sin6_addr) > 0) {
		ret->family = P_SOCKET_FAMILY_INET6;
		return ret;
	}
#  endif /* AF_INET6 */
#endif /* P_OS_WIN */

	p_free (ret);
	return NULL;
}